

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pace.cpp
# Opt level: O1

void test_new_elimination_order(string *name,ArrayIDIDFunc *order)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  _Alloc_hider _Var5;
  uint uVar6;
  char cVar7;
  char cVar8;
  uint depth;
  char *__dest;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  size_type *psVar12;
  long *plVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  string msg;
  string __str_1;
  timeval tv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ArrayIDFunc<int> parent;
  timeval tv_1;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined8 uStack_138;
  string local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  ulong *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  ulong local_e0 [2];
  timeval local_d0;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 local_50 [24];
  ulong local_38;
  
  if ((order->super_ArrayIDFunc<int>).preimage_count_ == 0) {
    if (!print_verbose_status) {
      return;
    }
    pcVar2 = (name->_M_dataplus)._M_p;
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + name->_M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    gettimeofday(&local_d0,(__timezone_ptr_t)0x0);
    uVar16 = ((ulong)local_d0.tv_usec / 1000 + local_d0.tv_sec * 1000) - program_start_milli_time;
    cVar8 = '\x01';
    if (9 < uVar16) {
      uVar15 = uVar16;
      cVar7 = '\x04';
      do {
        cVar8 = cVar7;
        if (uVar15 < 100) {
          cVar8 = cVar8 + -2;
          goto LAB_00115202;
        }
        if (uVar15 < 1000) {
          cVar8 = cVar8 + -1;
          goto LAB_00115202;
        }
        if (uVar15 < 10000) goto LAB_00115202;
        bVar3 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar7 = cVar8 + '\x04';
      } while (bVar3);
      cVar8 = cVar8 + '\x01';
    }
LAB_00115202:
    local_150 = &local_140;
    std::__cxx11::string::_M_construct((ulong)&local_150,cVar8);
    std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_150,(uint)local_148,uVar16);
    uVar16 = 0xf;
    if (local_b0 != &local_a0) {
      uVar16 = local_a0;
    }
    if (uVar16 < (ulong)(local_148 + local_a8)) {
      uVar16 = 0xf;
      if (local_150 != &local_140) {
        uVar16 = local_140;
      }
      if ((ulong)(local_148 + local_a8) <= uVar16) {
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_b0);
        goto LAB_00115292;
      }
    }
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_150);
LAB_00115292:
    local_110 = &local_100;
    plVar9 = puVar10 + 2;
    if ((long *)*puVar10 == plVar9) {
      local_100 = *plVar9;
      lStack_f8 = puVar10[3];
    }
    else {
      local_100 = *plVar9;
      local_110 = (long *)*puVar10;
    }
    local_108 = puVar10[1];
    *puVar10 = plVar9;
    puVar10[1] = 0;
    *(undefined1 *)plVar9 = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_130.field_2._M_allocated_capacity = *psVar12;
      local_130.field_2._8_8_ = plVar9[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar12;
      local_130._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_130._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    write(2,local_130._M_dataplus._M_p,local_130._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    return;
  }
  compute_parent_array_from_elimination_order((ArrayIDIDFunc *)local_50,&tail,&head);
  depth = compute_tree_depth_of_parent_array((ArrayIDFunc<int> *)local_50);
  cVar8 = (char)((int)depth >> 0x1f);
  if ((int)depth < best_tree_depth) {
    format_parent_array_abi_cxx11_(&local_130,(ArrayIDFunc<int> *)local_50,depth);
    uVar16 = local_130._M_string_length + 1;
    __dest = (char *)operator_new__(uVar16);
    _Var5._M_p = local_130._M_dataplus._M_p;
    paVar1 = &local_130.field_2;
    memcpy(__dest,local_130._M_dataplus._M_p,uVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar1) {
      operator_delete(_Var5._M_p);
    }
    if ((int)depth < best_tree_depth) {
      if (best_decomposition != (char *)0x0) {
        operator_delete__(best_decomposition);
      }
      best_tree_depth = depth;
      best_decomposition = __dest;
      if (print_status == true) {
        uVar4 = -depth;
        if (0 < (int)depth) {
          uVar4 = depth;
        }
        uVar17 = 1;
        if (9 < uVar4) {
          uVar16 = (ulong)uVar4;
          uVar6 = 4;
          do {
            uVar17 = uVar6;
            uVar11 = (uint)uVar16;
            if (uVar11 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_001157eb;
            }
            if (uVar11 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_001157eb;
            }
            if (uVar11 < 10000) goto LAB_001157eb;
            uVar16 = uVar16 / 10000;
            uVar6 = uVar17 + 4;
          } while (99999 < uVar11);
          uVar17 = uVar17 + 1;
        }
LAB_001157eb:
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar17 - cVar8);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0] + (depth >> 0x1f),uVar17,uVar4);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1331e7);
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_80 = *plVar9;
          lStack_78 = puVar10[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar9;
          local_90 = (long *)*puVar10;
        }
        local_88 = puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        puVar14 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar14) {
          local_c0 = *puVar14;
          lStack_b8 = puVar10[3];
          local_d0.tv_sec = (__time_t)&local_c0;
        }
        else {
          local_c0 = *puVar14;
          local_d0.tv_sec = (__time_t)*puVar10;
        }
        local_d0.tv_usec = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        gettimeofday((timeval *)(local_50 + 0x10),(__timezone_ptr_t)0x0);
        uVar16 = (local_38 / 1000 + local_50._16_8_ * 1000) - program_start_milli_time;
        cVar8 = '\x01';
        if (9 < uVar16) {
          uVar15 = uVar16;
          cVar7 = '\x04';
          do {
            cVar8 = cVar7;
            if (uVar15 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_00115997;
            }
            if (uVar15 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_00115997;
            }
            if (uVar15 < 10000) goto LAB_00115997;
            bVar3 = 99999 < uVar15;
            uVar15 = uVar15 / 10000;
            cVar7 = cVar8 + '\x04';
          } while (bVar3);
          cVar8 = cVar8 + '\x01';
        }
LAB_00115997:
        local_f0 = local_e0;
        std::__cxx11::string::_M_construct((ulong)&local_f0,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_f0,local_e8,uVar16);
        uVar16 = CONCAT44(uStack_e4,local_e8) + local_d0.tv_usec;
        uVar15 = 0xf;
        if ((ulong *)local_d0.tv_sec != &local_c0) {
          uVar15 = local_c0;
        }
        if (uVar15 < uVar16) {
          uVar15 = 0xf;
          if (local_f0 != local_e0) {
            uVar15 = local_e0[0];
          }
          if (uVar15 < uVar16) goto LAB_00115a05;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,local_d0.tv_sec);
        }
        else {
LAB_00115a05:
          puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0)
          ;
        }
        local_150 = &local_140;
        puVar14 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar14) {
          local_140 = *puVar14;
          uStack_138 = puVar10[3];
        }
        else {
          local_140 = *puVar14;
          local_150 = (ulong *)*puVar10;
        }
        local_148 = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)puVar14 = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
        puVar14 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar14) {
          local_a0 = *puVar14;
          lStack_98 = puVar10[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *puVar14;
          local_b0 = (ulong *)*puVar10;
        }
        local_a8 = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(name->_M_dataplus)._M_p)
        ;
        plVar9 = puVar10 + 2;
        if ((long *)*puVar10 == plVar9) {
          local_100 = *plVar9;
          lStack_f8 = puVar10[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *plVar9;
          local_110 = (long *)*puVar10;
        }
        local_108 = puVar10[1];
        *puVar10 = plVar9;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        psVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_130.field_2._M_allocated_capacity = *psVar12;
          local_130.field_2._8_8_ = puVar10[3];
          local_130._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar12;
          local_130._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_130._M_string_length = puVar10[1];
        *puVar10 = psVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        if (local_110 != &local_100) {
          operator_delete(local_110);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150);
        }
        if (local_f0 != local_e0) {
          operator_delete(local_f0);
        }
        if ((ulong *)local_d0.tv_sec != &local_c0) {
          operator_delete((void *)local_d0.tv_sec);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        write(2,local_130._M_dataplus._M_p,local_130._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar1) {
          operator_delete(local_130._M_dataplus._M_p);
        }
      }
      __dest = (char *)0x0;
    }
    if (__dest != (char *)0x0) {
      operator_delete__(__dest);
    }
    goto LAB_00115c35;
  }
  if (print_verbose_status != true) goto LAB_00115c35;
  uVar4 = -depth;
  if (0 < (int)depth) {
    uVar4 = depth;
  }
  uVar17 = 1;
  if (9 < uVar4) {
    uVar16 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar17 = uVar6;
      uVar11 = (uint)uVar16;
      if (uVar11 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_0011539c;
      }
      if (uVar11 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_0011539c;
      }
      if (uVar11 < 10000) goto LAB_0011539c;
      uVar16 = uVar16 / 10000;
      uVar6 = uVar17 + 4;
    } while (99999 < uVar11);
    uVar17 = uVar17 + 1;
  }
LAB_0011539c:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar17 - cVar8);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0] + (depth >> 0x1f),uVar17,uVar4);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1331dc);
  local_90 = &local_80;
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_80 = *plVar13;
    lStack_78 = plVar9[3];
  }
  else {
    local_80 = *plVar13;
    local_90 = (long *)*plVar9;
  }
  local_88 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar14 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar14) {
    local_c0 = *puVar14;
    lStack_b8 = plVar9[3];
    local_d0.tv_sec = (__time_t)&local_c0;
  }
  else {
    local_c0 = *puVar14;
    local_d0.tv_sec = (__time_t)*plVar9;
  }
  local_d0.tv_usec = plVar9[1];
  *plVar9 = (long)puVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  gettimeofday((timeval *)(local_50 + 0x10),(__timezone_ptr_t)0x0);
  uVar16 = (local_38 / 1000 + local_50._16_8_ * 1000) - program_start_milli_time;
  cVar8 = '\x01';
  if (9 < uVar16) {
    uVar15 = uVar16;
    cVar7 = '\x04';
    do {
      cVar8 = cVar7;
      if (uVar15 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00115543;
      }
      if (uVar15 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00115543;
      }
      if (uVar15 < 10000) goto LAB_00115543;
      bVar3 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar7 = cVar8 + '\x04';
    } while (bVar3);
    cVar8 = cVar8 + '\x01';
  }
LAB_00115543:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_f0,local_e8,uVar16);
  uVar16 = CONCAT44(uStack_e4,local_e8) + local_d0.tv_usec;
  uVar15 = 0xf;
  if ((ulong *)local_d0.tv_sec != &local_c0) {
    uVar15 = local_c0;
  }
  if (uVar15 < uVar16) {
    uVar15 = 0xf;
    if (local_f0 != local_e0) {
      uVar15 = local_e0[0];
    }
    if (uVar15 < uVar16) goto LAB_001155b1;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,local_d0.tv_sec);
  }
  else {
LAB_001155b1:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
  }
  local_150 = &local_140;
  puVar14 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar14) {
    local_140 = *puVar14;
    uStack_138 = puVar10[3];
  }
  else {
    local_140 = *puVar14;
    local_150 = (ulong *)*puVar10;
  }
  local_148 = puVar10[1];
  *puVar10 = puVar14;
  puVar10[1] = 0;
  *(undefined1 *)puVar14 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar14 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar14) {
    local_a0 = *puVar14;
    lStack_98 = plVar9[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar14;
    local_b0 = (ulong *)*plVar9;
  }
  local_a8 = plVar9[1];
  *plVar9 = (long)puVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(name->_M_dataplus)._M_p);
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_100 = *plVar13;
    lStack_f8 = plVar9[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar13;
    local_110 = (long *)*plVar9;
  }
  local_108 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_130.field_2._M_allocated_capacity = *psVar12;
    local_130.field_2._8_8_ = plVar9[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar12;
    local_130._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_130._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if ((ulong *)local_d0.tv_sec != &local_c0) {
    operator_delete((void *)local_d0.tv_sec);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  write(2,local_130._M_dataplus._M_p,local_130._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
LAB_00115c35:
  if ((int *)local_50._8_8_ == (int *)0x0) {
    return;
  }
  operator_delete__((void *)local_50._8_8_);
  return;
}

Assistant:

void test_new_elimination_order(std::string name, const ArrayIDIDFunc& order)
{
    if(order.preimage_count() == 0){
        if (print_verbose_status) {
            string msg = name+" was aborted after " + to_string(get_milli_time() - program_start_milli_time) + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }
        return;
    }
    ArrayIDFunc<int> parent = compute_parent_array_from_elimination_order(tail, head, order);
    int depth = compute_tree_depth_of_parent_array(parent);
    if (depth < best_tree_depth) {
        char* new_decomposition;
        {
            std::string s = format_parent_array(parent, depth);
            new_decomposition = new char[s.length() + 1];
            memcpy(new_decomposition, s.c_str(), s.length() + 1);
        }
#ifdef PARALLELIZE
#pragma omp critical
#endif
        {
            if (depth < best_tree_depth) {
                delete[] best_decomposition;
                best_decomposition = new_decomposition;
                new_decomposition = nullptr;
                best_tree_depth = depth;
                if (print_status) {
                    string msg = "depth " + to_string(best_tree_depth) + " found after " + to_string(get_milli_time() - program_start_milli_time) + " ms by " + name + "\n";
                    ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
                }
            }
        }
        delete[] new_decomposition;
    }else{
        if (print_verbose_status) {
            string msg = "not better depth " + to_string(depth) + " found after " + to_string(get_milli_time() - program_start_milli_time) + " ms by " + name + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }
    }
}